

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O1

StringRef __thiscall llvm::ARM::getDefaultCPU(ARM *this,StringRef Arch)

{
  ArchKind AVar1;
  char *pcVar2;
  long lVar3;
  size_t sVar4;
  StringRef SVar5;
  StringRef Arch_00;
  
  Arch_00.Length = Arch.Data;
  Arch_00.Data = (char *)this;
  AVar1 = parseArch(Arch_00);
  if (AVar1 == INVALID) {
    sVar4 = 0;
    pcVar2 = (char *)0x0;
  }
  else {
    lVar3 = 0x14;
    pcVar2 = "generic";
    do {
      if ((*(ArchKind *)(&UNK_002062ec + lVar3) == AVar1) &&
         ((*(byte *)((long)&(anonymous_namespace)::CPUNames + lVar3) & 1) != 0)) {
        pcVar2 = *(char **)(&UNK_002062dc + lVar3);
        sVar4 = *(size_t *)(&UNK_002062e4 + lVar3);
        goto LAB_001a89c5;
      }
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0xa94);
    sVar4 = 7;
  }
LAB_001a89c5:
  SVar5.Length = sVar4;
  SVar5.Data = pcVar2;
  return SVar5;
}

Assistant:

StringRef llvm::ARM::getDefaultCPU(StringRef Arch) {
  ArchKind AK = parseArch(Arch);
  if (AK == ARM::ArchKind::INVALID)
    return StringRef();

  // Look for multiple AKs to find the default for pair AK+Name.
  for (const auto CPU : CPUNames) {
    if (CPU.ArchID == AK && CPU.Default)
      return CPU.getName();
  }

  // If we can't find a default then target the architecture instead
  return "generic";
}